

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

bool __thiscall
fmt::v8::detail::write_int_localized<fmt::v8::appender,unsigned__int128,char>
          (detail *this,appender *out,unsigned___int128 value,uint prefix,
          basic_format_specs<char> *specs,locale_ref loc)

{
  undefined1 value_00 [16];
  appender aVar1;
  locale_ref in_R9;
  _Alloc_hider in_stack_ffffffffffffffa8;
  size_type in_stack_ffffffffffffffb0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  digit_grouping<char>::digit_grouping((digit_grouping<char> *)&stack0xffffffffffffffa8,in_R9,true);
  value_00._8_8_ = in_stack_ffffffffffffffb0;
  value_00._0_8_ = in_stack_ffffffffffffffa8._M_p;
  aVar1 = write_int_localized<fmt::v8::appender,unsigned__int128,char>
                    (*(detail **)this,(appender)out,(unsigned___int128)value_00,prefix,
                     (basic_format_specs<char> *)((ulong)specs & 0xffffffff),
                     (digit_grouping<char> *)loc.locale_);
  *(back_insert_iterator<fmt::v8::detail::buffer<char>_> *)this =
       aVar1.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_ffffffffffffffa8._M_p != &local_48) {
    operator_delete(in_stack_ffffffffffffffa8._M_p,local_48._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

auto write_int_localized(OutputIt& out, UInt value, unsigned prefix,
                         const basic_format_specs<Char>& specs, locale_ref loc)
    -> bool {
  auto grouping = digit_grouping<Char>(loc);
  out = write_int_localized(out, value, prefix, specs, grouping);
  return true;
}